

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O1

String * __thiscall
axl::zip::ZipReader::getFileName(String *__return_storage_ptr__,ZipReader *this,size_t index)

{
  mz_zip_archive_tag *pmVar1;
  mz_zip_internal_state *pmVar2;
  long lVar3;
  C *pFilename;
  uint filename_buf_size;
  
  pmVar1 = this->m_zip;
  filename_buf_size = 0;
  if ((((pmVar1 == (mz_zip_archive_tag *)0x0) ||
       (pmVar2 = pmVar1->m_pState, pmVar2 == (mz_zip_internal_state *)0x0)) ||
      (pmVar1->m_total_files <= (uint)index)) || (pmVar1->m_zip_mode != MZ_ZIP_MODE_READING)) {
    lVar3 = 0;
  }
  else {
    lVar3 = (ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (index & 0xffffffff) * 4) +
            (long)(pmVar2->m_central_dir).m_p;
  }
  if (lVar3 != 0) {
    filename_buf_size = *(ushort *)(lVar3 + 0x1c) + 1;
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_hdr + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_length + 1) = 0;
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
       (C *)0x0;
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
       (BufHdr *)0x0;
  pFilename = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
                        (__return_storage_ptr__,(ulong)filename_buf_size,false);
  mz_zip_reader_get_filename(this->m_zip,(uint)index,pFilename,filename_buf_size);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::chop(__return_storage_ptr__,1);
  return __return_storage_ptr__;
}

Assistant:

sl::String
ZipReader::getFileName(size_t index) const {
	ASSERT(isOpen());
	size_t size = mz_zip_reader_get_filename(m_zip, index, NULL, 0);

	sl::String fileName;
	char* p = fileName.createBuffer(size);
	mz_zip_reader_get_filename(m_zip, index, p, size);
	fileName.chop(1);
	return fileName;
}